

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

bool __thiscall
GlobOpt::HasLiveObjectHeaderInlinedTypeSym
          (GlobOpt *this,BasicBlock *block,bool isObjTypeSpecialized,SymID opndId)

{
  Type TVar1;
  EquivalentTypeSet *this_00;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  TypeId TVar5;
  undefined4 *puVar6;
  Value *pVVar7;
  JsTypeValueInfo *pJVar8;
  JITType *pJVar9;
  JITTypeHandler *pJVar10;
  undefined7 in_register_00000011;
  SymID typeSymId;
  Type_conflict pBVar11;
  ulong uVar12;
  uint16 index;
  ulong uVar13;
  nullptr_t local_48;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder type;
  
  if ((this->objectTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     (pBVar11 = this->objectTypeSyms->head, pBVar11 != (Type_conflict)0x0)) {
    puVar6 = (undefined4 *)
             __tls_get_addr(&PTR_01548f08,block,CONCAT71(in_register_00000011,isObjTypeSpecialized))
    ;
    do {
      uVar13 = (pBVar11->data).word;
      if (uVar13 != 0) {
        TVar1 = pBVar11->startIndex;
        uVar12 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        do {
          typeSymId = TVar1 + (BVIndex)uVar12;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar12);
          type.t._4_4_ = typeSymId;
          if ((typeSymId != opndId) &&
             (pVVar7 = GlobOptBlockData::FindObjectTypeValue(&block->globOptData,typeSymId),
             pVVar7 != (Value *)0x0)) {
            pJVar8 = ValueInfo::AsJsType(pVVar7->valueInfo);
            if (pJVar8 == (JsTypeValueInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                 ,0x3f7,"(valueInfo)","valueInfo");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar6 = 0;
            }
            local_40.t = (pJVar8->jsType).t;
            local_48 = (nullptr_t)0x0;
            bVar3 = JITTypeHolderBase<void>::operator!=(&local_40,&local_48);
            if (bVar3) {
              local_40.t = (pJVar8->jsType).t;
              pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
              TVar5 = JITType::GetTypeId(pJVar9);
              bVar3 = Js::DynamicType::Is(TVar5);
              if (bVar3) {
                pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
                pJVar10 = JITType::GetTypeHandler(pJVar9);
                bVar3 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar10);
                if (bVar3) {
LAB_0049bb4b:
                  BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                                    ((this->currentBlock->globOptData).liveFields,type.t._4_4_);
                  if (BVar4 != '\0') {
                    return true;
                  }
                }
              }
            }
            else {
              this_00 = pJVar8->jsTypeSet;
              if ((this_00 != (EquivalentTypeSet *)0x0) && (this_00->count != 0)) {
                index = 0;
                do {
                  local_40.t = (Type)Js::EquivalentTypeSet::GetType(this_00,index);
                  local_48 = (nullptr_t)0x0;
                  bVar3 = JITTypeHolderBase<void>::operator!=(&local_40,&local_48);
                  if (bVar3) {
                    pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
                    TVar5 = JITType::GetTypeId(pJVar9);
                    bVar3 = Js::DynamicType::Is(TVar5);
                    if (bVar3) {
                      pJVar9 = JITTypeHolderBase<void>::operator->(&local_40);
                      pJVar10 = JITType::GetTypeHandler(pJVar9);
                      bVar3 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar10);
                      if (bVar3) goto LAB_0049bb4b;
                    }
                  }
                  index = index + 1;
                } while (index < this_00->count);
              }
            }
          }
          uVar13 = uVar13 & ~(1L << (uVar12 & 0x3f));
          uVar12 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
        } while (uVar13 != 0);
      }
      pBVar11 = pBVar11->next;
    } while (pBVar11 != (Type)0x0);
  }
  return false;
}

Assistant:

bool
GlobOpt::HasLiveObjectHeaderInlinedTypeSym(BasicBlock *block, bool isObjTypeSpecialized, SymID opndId)
{
    return this->MapObjectHeaderInlinedTypeSymsUntil(block, true, opndId, [&](SymID symId)->bool { return this->currentBlock->globOptData.liveFields->Test(symId); });
}